

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::bt_peer_connection::write_hashes
          (bt_peer_connection *this,hash_request *req,span<libtorrent::digest32<256L>_> hashes)

{
  file_index_t index;
  uint uVar1;
  int iVar2;
  long lVar3;
  uchar *puVar4;
  span<char> *this_00;
  char *pcVar5;
  bt_peer_connection *pbVar6;
  digest32<256L> *pdVar7;
  bool bVar8;
  difference_type dVar9;
  index_type iVar10;
  long l;
  unsigned_long uVar11;
  char *pcVar12;
  char *last;
  element_type *this_01;
  torrent_info *this_02;
  file_storage *this_03;
  iterator __last;
  const_iterator __last_00;
  counters *this_04;
  int iVar13;
  ulong uVar14;
  undefined8 uStack_1b0;
  char acStack_1a8 [8];
  uint local_1a0;
  undefined1 local_199;
  counters *local_198;
  char *local_190;
  const_iterator local_188;
  uchar *local_180;
  char *local_178;
  iterator local_170;
  uchar *local_168;
  file_storage *local_160;
  torrent_info *local_158;
  span<char> *local_150;
  char *local_148;
  difference_type local_140;
  long local_138;
  bt_peer_connection *local_130;
  span<const_char> local_128;
  digest32<256L> *local_118;
  digest32<256L> *h;
  digest32<256L> *__end2;
  digest32<256L> *__begin2;
  span<libtorrent::digest32<256L>_> *__range2;
  undefined1 local_f0 [8];
  sha256_hash root;
  file_storage *fs;
  torrent_info *ti;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  shared_ptr<libtorrent::aux::torrent> t;
  char *local_88;
  char *ptr;
  alloca_destructor<char> buf_destructor;
  char *local_68;
  char *TORRENT_ALLOCA_tmp;
  char *local_50;
  long local_48;
  long TORRENT_ALLOCA_size;
  span<char> buf;
  int packet_size;
  hash_request *req_local;
  bt_peer_connection *this_local;
  span<libtorrent::digest32<256L>_> hashes_local;
  
  hashes_local.m_ptr = (digest32<256L> *)hashes.m_len;
  this_local = (bt_peer_connection *)hashes.m_ptr;
  pcVar12 = acStack_1a8;
  uStack_1b0 = 0x22cfcd;
  local_130 = this;
  dVar9 = digest32<256L>::size();
  local_138 = dVar9 + 0x15;
  uStack_1b0 = 0x22cfe1;
  local_140 = digest32<256L>::size();
  uStack_1b0 = 0x22cff1;
  iVar10 = span<libtorrent::digest32<256L>_>::size((span<libtorrent::digest32<256L>_> *)&this_local)
  ;
  buf.m_len._4_4_ = (int)local_138 + (int)local_140 * (int)iVar10;
  uStack_1b0 = 0x22d015;
  span<char>::span((span<char> *)&TORRENT_ALLOCA_size);
  uStack_1b0 = 0x22d01d;
  l = numeric_cast<long,int,void>(buf.m_len._4_4_);
  local_48 = l;
  if (l < 0x1001) {
    if (0 < buf.m_len._4_4_) {
      lVar3 = -((long)buf.m_len._4_4_ + 0xfU & 0xfffffffffffffff0);
      pcVar12 = acStack_1a8 + lVar3;
      *(undefined8 *)((long)&uStack_1b0 + lVar3) = 0x22d08d;
      span<char>::span((span<char> *)&buf_destructor.objects.m_len,pcVar12,l);
      TORRENT_ALLOCA_size = buf_destructor.objects.m_len;
      buf.m_ptr = local_68;
      *(undefined8 *)((long)&uStack_1b0 + lVar3) = 0x22d0a6;
      local_148 = span<char>::begin((span<char> *)&TORRENT_ALLOCA_size);
      *(undefined8 *)((long)&uStack_1b0 + lVar3) = 0x22d0b6;
      last = span<char>::end((span<char> *)&TORRENT_ALLOCA_size);
      pcVar5 = local_148;
      *(undefined8 *)((long)&uStack_1b0 + lVar3) = 0x22d0c5;
      uninitialized_default_construct<char*>(pcVar5,last);
    }
  }
  else {
    uStack_1b0 = 0x22d033;
    uVar11 = numeric_cast<unsigned_long,int,void>(buf.m_len._4_4_);
    uStack_1b0 = 0x22d03b;
    pcVar12 = (char *)operator_new__(uVar11);
    uStack_1b0 = 0x22d04b;
    span<char>::span((span<char> *)&TORRENT_ALLOCA_tmp,pcVar12,local_48);
    TORRENT_ALLOCA_size = (long)TORRENT_ALLOCA_tmp;
    buf.m_ptr = local_50;
    pcVar12 = acStack_1a8;
  }
  local_150 = (span<char> *)&TORRENT_ALLOCA_size;
  pcVar12[-8] = -0x25;
  pcVar12[-7] = -0x30;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  span<char>::span<libtorrent::span<char>,char,void>
            ((span<char> *)&ptr,(span<char> *)&TORRENT_ALLOCA_size);
  this_00 = local_150;
  pcVar12[-8] = -0x19;
  pcVar12[-7] = -0x30;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  local_88 = span<char>::data(this_00);
  iVar13 = buf.m_len._4_4_ + -4;
  pcVar12[-8] = -6;
  pcVar12[-7] = -0x30;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  write_uint32<int,char*>(iVar13,&local_88);
  pcVar12[-8] = '\n';
  pcVar12[-7] = -0x2f;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  write_uint8<libtorrent::aux::bt_peer_connection::message_type,char*>(msg_hashes,&local_88);
  pcVar12[-8] = '\x1f';
  pcVar12[-7] = -0x2f;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  peer_connection::associated_torrent((peer_connection *)local_b8);
  pcVar12[-8] = '4';
  pcVar12[-7] = -0x2f;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)local_a8);
  pcVar12[-8] = '@';
  pcVar12[-7] = -0x2f;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)local_b8);
  pcVar12[-8] = 'L';
  pcVar12[-7] = -0x2f;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  bVar8 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a8);
  if (bVar8) {
    pcVar12[-8] = -0x7e;
    pcVar12[-7] = -0x2f;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    this_01 = ::std::
              __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_a8);
    pcVar12[-8] = -0x76;
    pcVar12[-7] = -0x2f;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    this_02 = torrent::torrent_file(this_01);
    local_158 = this_02;
    pcVar12[-8] = -0x53;
    pcVar12[-7] = -0x2f;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    this_03 = torrent_info::files(this_02);
    index.m_val = (req->file).m_val;
    local_160 = this_03;
    __range2._4_4_ = index.m_val;
    root.m_number._M_elems._24_8_ = this_03;
    pcVar12[-8] = -0x17;
    pcVar12[-7] = -0x2f;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    file_storage::root((sha256_hash *)local_f0,this_03,index);
    pcVar12[-8] = -9;
    pcVar12[-7] = -0x2f;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    local_168 = digest32<256L>::begin((digest32<256L> *)local_f0);
    pcVar12[-8] = '\f';
    pcVar12[-7] = -0x2e;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    __last = digest32<256L>::end((digest32<256L> *)local_f0);
    pcVar5 = local_88;
    puVar4 = local_168;
    local_170 = __last;
    pcVar12[-8] = ',';
    pcVar12[-7] = -0x2e;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    local_178 = ::std::copy<unsigned_char*,char*>(puVar4,__last,pcVar5);
    iVar13 = req->base;
    local_88 = local_178;
    pcVar12[-8] = 'P';
    pcVar12[-7] = -0x2e;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    write_uint32<int,char*>(iVar13,&local_88);
    iVar13 = req->index;
    pcVar12[-8] = 'b';
    pcVar12[-7] = -0x2e;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    write_uint32<int,char*>(iVar13,&local_88);
    iVar13 = req->count;
    pcVar12[-8] = 't';
    pcVar12[-7] = -0x2e;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    write_uint32<int,char*>(iVar13,&local_88);
    iVar13 = req->proof_layers;
    pcVar12[-8] = -0x7a;
    pcVar12[-7] = -0x2e;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    write_uint32<int,char*>(iVar13,&local_88);
    __begin2 = (digest32<256L> *)&this_local;
    pcVar12[-8] = -0x61;
    pcVar12[-7] = -0x2e;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    __end2 = span<libtorrent::digest32<256L>_>::begin
                       ((span<libtorrent::digest32<256L>_> *)&this_local);
    pdVar7 = __begin2;
    pcVar12[-8] = -0x4e;
    pcVar12[-7] = -0x2e;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    h = span<libtorrent::digest32<256L>_>::end((span<libtorrent::digest32<256L>_> *)pdVar7);
    for (; pdVar7 = __end2, pbVar6 = local_130, __end2 != h; __end2 = __end2 + 1) {
      local_118 = __end2;
      pcVar12[-8] = -0x19;
      pcVar12[-7] = -0x2e;
      pcVar12[-6] = '\"';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      local_180 = digest32<256L>::begin(pdVar7);
      pdVar7 = local_118;
      pcVar12[-8] = -4;
      pcVar12[-7] = -0x2e;
      pcVar12[-6] = '\"';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      __last_00 = digest32<256L>::end(pdVar7);
      pcVar5 = local_88;
      puVar4 = local_180;
      local_188 = __last_00;
      pcVar12[-8] = '\x1c';
      pcVar12[-7] = -0x2d;
      pcVar12[-6] = '\"';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      local_190 = ::std::copy<unsigned_char_const*,char*>(puVar4,__last_00,pcVar5);
      local_88 = local_190;
    }
    pcVar12[-8] = 'v';
    pcVar12[-7] = -0x2d;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    this_04 = peer_connection::stats_counters(&pbVar6->super_peer_connection);
    local_198 = this_04;
    pcVar12[-8] = -0x6b;
    pcVar12[-7] = -0x2d;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    counters::inc_stats_counter(this_04,0x69,1);
    pbVar6 = local_130;
    pcVar12[-8] = -0x5a;
    pcVar12[-7] = -0x2d;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    local_199 = peer_connection::should_log(&pbVar6->super_peer_connection,outgoing_message);
    if ((bool)local_199) {
      pcVar12[-8] = -0x3d;
      pcVar12[-7] = -0x2d;
      pcVar12[-6] = '\"';
      pcVar12[-5] = '\0';
      pcVar12[-4] = '\0';
      pcVar12[-3] = '\0';
      pcVar12[-2] = '\0';
      pcVar12[-1] = '\0';
      local_1a0 = strong_typedef::operator_cast_to_int((strong_typedef *)req);
      pbVar6 = local_130;
      uVar14 = (ulong)local_1a0;
      uVar1 = req->base;
      iVar13 = req->count;
      iVar2 = req->proof_layers;
      *(int *)(pcVar12 + -0x20) = req->index;
      *(int *)(pcVar12 + -0x18) = iVar13;
      *(int *)(pcVar12 + -0x10) = iVar2;
      pcVar12[-0x28] = '#';
      pcVar12[-0x27] = -0x2c;
      pcVar12[-0x26] = '\"';
      pcVar12[-0x25] = '\0';
      pcVar12[-0x24] = '\0';
      pcVar12[-0x23] = '\0';
      pcVar12[-0x22] = '\0';
      pcVar12[-0x21] = '\0';
      peer_connection::peer_log
                (&pbVar6->super_peer_connection,outgoing_message,"HASHES",
                 "file: %d base: %d idx: %d cnt: %d proofs: %d",uVar14,(ulong)uVar1);
    }
    pcVar12[-8] = '7';
    pcVar12[-7] = -0x2c;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    span<char_const>::span<libtorrent::span<char>,char,void>
              ((span<char_const> *)&local_128,(span<char> *)&TORRENT_ALLOCA_size);
    pbVar6 = local_130;
    pcVar12[-8] = 'S';
    pcVar12[-7] = -0x2c;
    pcVar12[-6] = '\"';
    pcVar12[-5] = '\0';
    pcVar12[-4] = '\0';
    pcVar12[-3] = '\0';
    pcVar12[-2] = '\0';
    pcVar12[-1] = '\0';
    peer_connection::send_buffer(&pbVar6->super_peer_connection,local_128);
  }
  pcVar12[-8] = 'k';
  pcVar12[-7] = -0x2c;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)local_a8);
  pcVar12[-8] = 't';
  pcVar12[-7] = -0x2c;
  pcVar12[-6] = '\"';
  pcVar12[-5] = '\0';
  pcVar12[-4] = '\0';
  pcVar12[-3] = '\0';
  pcVar12[-2] = '\0';
  pcVar12[-1] = '\0';
  alloca_destructor<char>::~alloca_destructor((alloca_destructor<char> *)&ptr);
  return;
}

Assistant:

void bt_peer_connection::write_hashes(hash_request const& req, span<sha256_hash> hashes)
	{
		INVARIANT_CHECK;

		int const packet_size = int(5 + sha256_hash::size()
			+ 4 * 4
			+ sha256_hash::size() * hashes.size());
		TORRENT_ALLOCA(buf, char, packet_size);
		char* ptr = buf.data();
		aux::write_uint32(packet_size - 4, ptr);
		aux::write_uint8(msg_hashes, ptr);

		auto t = associated_torrent().lock();
		if (!t) return;
		auto const& ti = t->torrent_file();
		auto const& fs = ti.files();
		auto root = fs.root(req.file);

		ptr = std::copy(root.begin(), root.end(), ptr);

		aux::write_uint32(req.base, ptr);
		aux::write_uint32(req.index, ptr);
		aux::write_uint32(req.count, ptr);
		aux::write_uint32(req.proof_layers, ptr);

		for (auto const& h : hashes)
			ptr = std::copy(h.begin(), h.end(), ptr);

		stats_counters().inc_stats_counter(counters::num_outgoing_hashes);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			peer_log(peer_log_alert::outgoing_message, "HASHES"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(req.file), req.base, req.index, req.count, req.proof_layers);
		}
#endif

		send_buffer(buf);
	}